

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O1

bool basist::compute_least_squares_endpoints_rgb
               (color32 *pColors,uint8_t *pSelectors,vec3F *pXl,vec3F *pXh)

{
  byte bVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  color32 *pcVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint32_t i;
  uint uVar13;
  long lVar14;
  uint uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  undefined1 auVar23 [16];
  float fVar24;
  undefined1 auVar25 [16];
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  undefined1 auVar32 [16];
  float fVar33;
  float fVar34;
  
  lVar14 = 0;
  uVar3 = 0;
  uVar9 = 0;
  uVar10 = 0;
  uVar11 = 0;
  uVar12 = 0;
  uVar4 = 0;
  uVar5 = 0;
  do {
    bVar1 = pSelectors[lVar14];
    uVar6 = (uint)pColors[lVar14].field_0.field_0.r;
    uVar9 = uVar9 + uVar6;
    uVar13 = (uint)pColors[lVar14].field_0.field_0.g;
    uVar11 = uVar11 + uVar13;
    uVar15 = (uint)pColors[lVar14].field_0.field_0.b;
    uVar4 = uVar4 + uVar15;
    uVar5 = uVar5 + compute_least_squares_endpoints_rgb::s_weight_vals[bVar1];
    uVar3 = uVar3 + uVar6 * bVar1;
    uVar10 = uVar10 + uVar13 * bVar1;
    uVar12 = uVar12 + bVar1 * uVar15;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 0x10);
  uVar6 = uVar5 >> 0x10 & 0xff;
  uVar13 = uVar5 >> 8 & 0xff;
  fVar31 = (float)(int)(uVar6 * (uVar5 & 0xff) - uVar13 * uVar13);
  fVar16 = ABS(fVar31);
  if (1e-08 <= fVar16) {
    fVar22 = (float)uVar12;
    fVar19 = (float)uVar4 * 3.0 - fVar22;
    fVar26 = (float)uVar10;
    fVar24 = (float)uVar11 * 3.0 - fVar26;
    fVar34 = (float)uVar3;
    fVar33 = (float)uVar9 * 3.0 - fVar34;
    fVar31 = 3.0 / fVar31;
    fVar18 = (float)(uVar5 & 0xff) * fVar31;
    fVar17 = (float)((uint)(float)uVar13 | (uint)DAT_001e9030) * fVar31;
    fVar31 = fVar31 * (float)uVar6;
    pXl->c[0] = fVar17 * fVar33 + fVar18 * fVar34;
    pXh->c[0] = fVar33 * fVar31 + fVar34 * fVar17;
    pXl->c[1] = fVar24 * fVar17 + fVar18 * fVar26;
    pXh->c[1] = fVar24 * fVar31 + fVar26 * fVar17;
    pXl->c[2] = fVar19 * fVar17 + fVar18 * fVar22;
    pXh->c[2] = fVar31 * fVar19 + fVar17 * fVar22;
    auVar2 = _DAT_001e9030;
    pcVar8 = pColors + 3;
    lVar14 = 0;
    do {
      if ((pXl->c[lVar14] <= 0.0 && pXl->c[lVar14] != 0.0) || (255.0 < pXh->c[lVar14])) {
        auVar21._8_4_ = 0xffffffff;
        auVar21._0_8_ = 0xffffffffffffffff;
        auVar21._12_4_ = 0xffffffff;
        auVar23 = ZEXT816(0);
        lVar7 = 0;
        do {
          auVar25._8_8_ =
               (ulong)pcVar8[lVar7 + -1].field_0.field_0.r |
               (ulong)pcVar8[lVar7].field_0.field_0.r << 0x20;
          auVar25._0_8_ =
               (ulong)pcVar8[lVar7 + -3].field_0.field_0.r |
               (ulong)pcVar8[lVar7 + -2].field_0.field_0.r << 0x20;
          auVar27 = auVar25 | auVar2;
          auVar20 = auVar21 ^ auVar2;
          uVar3 = auVar2._0_4_;
          auVar32._0_4_ = -(uint)(auVar27._0_4_ < (int)(auVar23._0_4_ ^ uVar3));
          auVar32._4_4_ = -(uint)(auVar27._4_4_ < (int)(auVar23._4_4_ ^ auVar2._4_4_));
          auVar32._8_4_ = -(uint)(auVar27._8_4_ < (int)(auVar23._8_4_ ^ auVar2._8_4_));
          auVar32._12_4_ = -(uint)(auVar27._12_4_ < (int)(auVar23._12_4_ ^ auVar2._12_4_));
          auVar28._0_4_ = -(uint)(auVar20._0_4_ < auVar27._0_4_);
          auVar28._4_4_ = -(uint)(auVar20._4_4_ < auVar27._4_4_);
          auVar28._8_4_ = -(uint)(auVar20._8_4_ < auVar27._8_4_);
          auVar28._12_4_ = -(uint)(auVar20._12_4_ < auVar27._12_4_);
          auVar21 = ~auVar28 & auVar25 | auVar21 & auVar28;
          auVar20._4_4_ = auVar23._4_4_ & auVar32._4_4_;
          auVar20._0_4_ = auVar23._0_4_ & auVar32._0_4_;
          auVar20._8_4_ = auVar23._8_4_ & auVar32._8_4_;
          auVar20._12_4_ = auVar23._12_4_ & auVar32._12_4_;
          auVar23 = ~auVar32 & auVar25 | auVar20;
          lVar7 = lVar7 + 4;
        } while (lVar7 != 0x10);
        auVar27._0_8_ = auVar23._8_8_;
        auVar27._8_4_ = auVar23._8_4_;
        auVar27._12_4_ = auVar23._12_4_;
        auVar20 = auVar23 ^ auVar2;
        auVar32 = auVar27 ^ auVar2;
        auVar29._0_4_ = -(uint)(auVar32._0_4_ < auVar20._0_4_);
        auVar29._4_4_ = -(uint)(auVar32._4_4_ < auVar20._4_4_);
        auVar29._8_4_ = -(uint)(auVar32._8_4_ < auVar20._8_4_);
        auVar29._12_4_ = -(uint)(auVar32._12_4_ < auVar20._12_4_);
        auVar23 = ~auVar29 & auVar27 | auVar23 & auVar29;
        uVar9 = auVar23._4_4_;
        uVar4 = auVar23._0_4_;
        uVar5 = -(uint)((int)(uVar9 ^ uVar3) < (int)(uVar4 ^ uVar3));
        uVar5 = ~uVar5 & uVar9 | uVar4 & uVar5;
        auVar23._0_8_ = auVar21._8_8_;
        auVar23._8_4_ = auVar21._8_4_;
        auVar23._12_4_ = auVar21._12_4_;
        auVar20 = auVar21 ^ auVar2;
        auVar32 = auVar23 ^ auVar2;
        auVar30._0_4_ = -(uint)(auVar20._0_4_ < auVar32._0_4_);
        auVar30._4_4_ = -(uint)(auVar20._4_4_ < auVar32._4_4_);
        auVar30._8_4_ = -(uint)(auVar20._8_4_ < auVar32._8_4_);
        auVar30._12_4_ = -(uint)(auVar20._12_4_ < auVar32._12_4_);
        auVar21 = ~auVar30 & auVar23 | auVar21 & auVar30;
        uVar9 = auVar21._4_4_;
        uVar4 = auVar21._0_4_;
        uVar3 = -(uint)((int)(uVar4 ^ uVar3) < (int)(uVar9 ^ uVar3));
        uVar3 = ~uVar3 & uVar9 | uVar4 & uVar3;
        if (uVar3 == uVar5) {
          pXl->c[lVar14] = (float)(int)uVar3;
          pXh->c[lVar14] = (float)(int)uVar5;
        }
      }
      lVar14 = lVar14 + 1;
      pcVar8 = (color32 *)((long)&pcVar8->field_0 + 1);
    } while (lVar14 != 3);
  }
  return 1e-08 <= fVar16;
}

Assistant:

static bool compute_least_squares_endpoints_rgb(const color32* pColors, const uint8_t* pSelectors, vec3F* pXl, vec3F* pXh)
	{
		// Derived from bc7enc16's LS function.
		// Least squares using normal equations: http://www.cs.cornell.edu/~bindel/class/cs3220-s12/notes/lec10.pdf 
		// I did this in matrix form first, expanded out all the ops, then optimized it a bit.
		uint32_t uq00_r = 0, uq10_r = 0, ut_r = 0, uq00_g = 0, uq10_g = 0, ut_g = 0, uq00_b = 0, uq10_b = 0, ut_b = 0;

		// This table is: 9 * (w * w), 9 * ((1.0f - w) * w), 9 * ((1.0f - w) * (1.0f - w))
		// where w is [0,1/3,2/3,1]. 9 is the perfect multiplier.
		static const uint32_t s_weight_vals[4] = { 0x000009, 0x010204, 0x040201, 0x090000 };

		uint32_t weight_accum = 0;
		for (uint32_t i = 0; i < 16; i++)
		{
			const uint32_t r = pColors[i].c[0], g = pColors[i].c[1], b = pColors[i].c[2];
			const uint32_t sel = pSelectors[i];
			ut_r += r;
			ut_g += g;
			ut_b += b;
			weight_accum += s_weight_vals[sel];
			uq00_r += sel * r;
			uq00_g += sel * g;
			uq00_b += sel * b;
		}

		float q00_r = (float)uq00_r, q10_r = (float)uq10_r, t_r = (float)ut_r;
		float q00_g = (float)uq00_g, q10_g = (float)uq10_g, t_g = (float)ut_g;
		float q00_b = (float)uq00_b, q10_b = (float)uq10_b, t_b = (float)ut_b;

		q10_r = t_r * 3.0f - q00_r;
		q10_g = t_g * 3.0f - q00_g;
		q10_b = t_b * 3.0f - q00_b;

		float z00 = (float)((weight_accum >> 16) & 0xFF);
		float z10 = (float)((weight_accum >> 8) & 0xFF);
		float z11 = (float)(weight_accum & 0xFF);
		float z01 = z10;

		float det = z00 * z11 - z01 * z10;
		if (fabs(det) < 1e-8f)
			return false;

		det = 3.0f / det;

		float iz00, iz01, iz10, iz11;
		iz00 = z11 * det;
		iz01 = -z01 * det;
		iz10 = -z10 * det;
		iz11 = z00 * det;

		pXl->c[0] = iz00 * q00_r + iz01 * q10_r; pXh->c[0] = iz10 * q00_r + iz11 * q10_r;
		pXl->c[1] = iz00 * q00_g + iz01 * q10_g; pXh->c[1] = iz10 * q00_g + iz11 * q10_g;
		pXl->c[2] = iz00 * q00_b + iz01 * q10_b; pXh->c[2] = iz10 * q00_b + iz11 * q10_b;

		// Check and fix channel singularities - might not be needed, but is in UASTC's encoder.
		for (uint32_t c = 0; c < 3; c++)
		{
			if ((pXl->c[c] < 0.0f) || (pXh->c[c] > 255.0f))
			{
				uint32_t lo_v = UINT32_MAX, hi_v = 0;
				for (uint32_t i = 0; i < 16; i++)
				{
					lo_v = basisu::minimumu(lo_v, pColors[i].c[c]);
					hi_v = basisu::maximumu(hi_v, pColors[i].c[c]);
				}

				if (lo_v == hi_v)
				{
					pXl->c[c] = (float)lo_v;
					pXh->c[c] = (float)hi_v;
				}
			}
		}

		return true;
	}